

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::SMDImporter::ParseUnsignedInt
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,uint *out)

{
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  
  do {
    uVar2 = (ulong)(byte)*szCurrent;
    if (0x20 < uVar2) {
LAB_005f7ea2:
      uVar3 = 0;
      if (0xf5 < (byte)(*szCurrent - 0x3aU)) {
        uVar3 = 0;
        do {
          uVar3 = (uint)(byte)((char)uVar2 - 0x30) + uVar3 * 10;
          pbVar1 = (byte *)szCurrent + 1;
          uVar2 = (ulong)*pbVar1;
          szCurrent = (char *)((byte *)szCurrent + 1);
        } while (0xf5 < (byte)(*pbVar1 - 0x3a));
      }
      if (szCurrentOut != (char **)0x0) {
        *szCurrentOut = szCurrent;
      }
      *out = uVar3;
      return true;
    }
    if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
        return false;
      }
      goto LAB_005f7ea2;
    }
    szCurrent = (char *)((byte *)szCurrent + 1);
  } while( true );
}

Assistant:

bool SMDImporter::ParseUnsignedInt(const char* szCurrent, const char** szCurrentOut, unsigned int& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    out = strtoul10(szCurrent,szCurrentOut);
    return true;
}